

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenizerBase.cpp
# Opt level: O0

void __thiscall SGParser::TokenizerBase::AdjustHead(TokenizerBase *this)

{
  TokenizerBuffer *pTVar1;
  bool bVar2;
  TokenizerBase *this_local;
  
  bVar2 = false;
  if (this->pHeadBuffer != (TokenizerBuffer *)0x0) {
    bVar2 = this->pTailBuffer != (TokenizerBuffer *)0x0;
  }
  if (bVar2) {
    this->pHead = this->pTail;
    if (this->pHeadBuffer != this->pTailBuffer) {
      if (this->pFreeBuffer == (TokenizerBuffer *)0x0) {
        this->pFreeBuffer = this->pHeadBuffer;
        this->pHeadBuffer = this->pHeadBuffer->pNext;
      }
      while (this->pHeadBuffer != this->pTailBuffer) {
        pTVar1 = std::exchange<SGParser::TokenizerBuffer*,SGParser::TokenizerBuffer*&>
                           (&this->pHeadBuffer,&this->pHeadBuffer->pNext);
        if (pTVar1 != (TokenizerBuffer *)0x0) {
          operator_delete(pTVar1,0x2010);
        }
      }
    }
    return;
  }
  __assert_fail("pHeadBuffer && pTailBuffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/TokenizerBase.cpp"
                ,0x84,"void SGParser::TokenizerBase::AdjustHead()");
}

Assistant:

void TokenizerBase::AdjustHead() noexcept {
    SG_ASSERT(pHeadBuffer && pTailBuffer);

    // Move the Head to the Tail
    pHead = pTail;

    // Need to destroy a buffer
    if (pHeadBuffer != pTailBuffer) {
        // Save one of the buffers
        if (!pFreeBuffer) {
            pFreeBuffer = pHeadBuffer;
            pHeadBuffer = pHeadBuffer->pNext;
        }

        // Now go through and destroy all unused buffers
        while (pHeadBuffer != pTailBuffer)
            delete std::exchange(pHeadBuffer, pHeadBuffer->pNext);
    }
}